

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSParserImpl.cpp
# Opt level: O3

void __thiscall xercesc_4_0::DOMLSParserImpl::loadGrammar(DOMLSParserImpl *this)

{
  bool in_CL;
  GrammarType in_EDX;
  char *in_RSI;
  
  loadGrammar((DOMLSParserImpl *)&this[-1].super_AbstractDOMParser.fDocumentVector,in_RSI,in_EDX,
              in_CL);
  return;
}

Assistant:

Grammar* DOMLSParserImpl::loadGrammar(const char* const systemId,
                                     const Grammar::GrammarType grammarType,
                                     const bool toCache)
{
    // Avoid multiple entrance
    if (getParseInProgress())
        throw DOMException(DOMException::INVALID_STATE_ERR, XMLDOMMsg::LSParser_ParseInProgress, fMemoryManager);

    ResetParseType  resetParse(this, &DOMLSParserImpl::resetParse);

	Grammar* grammar = 0;

    try
    {
        setParseInProgress(true);
        if (grammarType == Grammar::DTDGrammarType)
            getScanner()->setDocTypeHandler(0);
        grammar = getScanner()->loadGrammar(systemId, grammarType, toCache);
    }
    catch(const OutOfMemoryException&)
    {
        resetParse.release();

        throw;
    }

    return grammar;
}